

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O2

void __thiscall Clasp::Cli::TextOutput::printSummary(TextOutput *this,Summary *run,bool final)

{
  int iVar1;
  uint uVar2;
  FacadePtr pCVar3;
  bool bVar4;
  byte bVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  SumVec *pSVar9;
  uint64 uVar10;
  Model *m;
  UPair UVar11;
  char *pcVar12;
  undefined7 in_register_00000011;
  TextOutput *pTVar13;
  Summary *this_00;
  TextOutput *pTVar14;
  char *pcVar15;
  undefined1 local_58 [24];
  
  pTVar14 = (TextOutput *)local_58;
  pTVar13 = this;
  if (((int)CONCAT71(in_register_00000011,final) != 0) && ((this->super_Output).quiet_[2] != '\x02')
     ) {
    comment(this,1,"%s\n",
            "====================================== Accumulation ======================================|"
           );
  }
  bVar5 = (run->result).flags & 3;
  if (bVar5 == 1) {
    pTVar13 = (TextOutput *)run;
    bVar4 = ClaspFacade::Summary::optimum(run);
    ppcVar6 = this->result + (ulong)bVar4 * 2 + 1;
  }
  else if (bVar5 == 2) {
    ppcVar6 = this->result + 2;
  }
  else {
    ppcVar6 = this->result;
  }
  if (**ppcVar6 != '\0') {
    pTVar13 = (TextOutput *)0x19e61b;
    printf("%s%s\n",this->format[3]);
  }
  if (((this->super_Output).verbose_ == 0) &&
     (bVar4 = Output::stats(&pTVar13->super_Output,run), !bVar4)) {
    return;
  }
  puts(this->format[0]);
  bVar5 = (run->result).flags;
  if ((bVar5 & 8) != 0) {
    pcVar12 = "INTERRUPTED";
    if ((run->result).signal == '\x0e') {
      pcVar12 = "TIME LIMIT";
    }
    printf("%s%-*s: %u\n",this->format[0],(ulong)(uint)this->width_,pcVar12,1);
    bVar5 = (run->result).flags;
  }
  pcVar12 = "";
  if ((bVar5 & 4) == 0) {
    pcVar12 = "+";
  }
  printf("%s%-*s: ",this->format[0],(ulong)(uint)this->width_,"Models");
  printf("%lu%s\n",run->numEnum,pcVar12);
  if (((run->result).flags & 3) == 1) {
    pcVar7 = ClaspFacade::Summary::consequences(run);
    if (pcVar7 != (char *)0x0) {
      pcVar7 = this->format[0];
      iVar1 = this->width_;
      pcVar8 = ClaspFacade::Summary::consequences(run);
      pcVar15 = "yes";
      if (((run->result).flags & 4) == 0) {
        pcVar15 = "unknown";
      }
      printf("%s  %-*s: %s\n",pcVar7,(ulong)(iVar1 - 2),pcVar8,pcVar15);
    }
    pSVar9 = ClaspFacade::Summary::costs(run);
    if (pSVar9 != (SumVec *)0x0) {
      pcVar7 = this->format[0];
      uVar2 = this->width_;
      bVar4 = ClaspFacade::Summary::optimum(run);
      pcVar8 = "unknown";
      if (bVar4) {
        pcVar8 = "yes";
      }
      printf("%s%-*s: %s\n",pcVar7,(ulong)uVar2,"  Optimum",pcVar8);
    }
    bVar4 = ClaspFacade::Summary::optimize(run);
    if (bVar4) {
      uVar10 = ClaspFacade::Summary::optimal(run);
      if (1 < uVar10) {
        pcVar7 = this->format[0];
        uVar2 = this->width_;
        uVar10 = ClaspFacade::Summary::optimal(run);
        printf("%s%-*s: %lu\n",pcVar7,(ulong)uVar2,"  Optimal",uVar10);
      }
      printf("%s%-*s: ",this->format[0],(ulong)(uint)this->width_,"Optimization");
      pTVar13 = (TextOutput *)run;
      pSVar9 = ClaspFacade::Summary::costs(run);
      printCostsImpl(pTVar13,pSVar9,' ',"");
      putchar(10);
    }
    pcVar7 = ClaspFacade::Summary::consequences(run);
    if (pcVar7 != (char *)0x0) {
      printf("%s%-*s: ",this->format[0],(ulong)(uint)this->width_,"Consequences");
      pCVar3 = run->facade;
      this_00 = run;
      m = ClaspFacade::Summary::model(run);
      UVar11 = Output::numCons((Output *)this_00,&(pCVar3->ctx).output,m);
      printf("%u%s\n",(ulong)UVar11 & 0xffffffff,pcVar12);
    }
  }
  bVar4 = ClaspFacade::Summary::hasLower(run);
  if ((bVar4) && (bVar4 = ClaspFacade::Summary::optimum(run), !bVar4)) {
    printf("%s%-*s: ",this->format[0],(ulong)(uint)this->width_,"Bounds");
    ClaspFacade::Summary::lower((Summary *)&stack0xffffffffffffffc0);
    pTVar13 = (TextOutput *)run;
    pSVar9 = ClaspFacade::Summary::costs(run);
    if (pSVar9 == (SumVec *)0x0) {
      local_58._0_8_ = (_func_int **)0x0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
    }
    else {
      pSVar9 = ClaspFacade::Summary::costs(run);
      bk_lib::pod_vector<long,_std::allocator<long>_>::pod_vector
                ((pod_vector<long,_std::allocator<long>_> *)local_58,pSVar9);
      pTVar13 = pTVar14;
    }
    printBounds(pTVar13,(SumVec *)&stack0xffffffffffffffc0,(SumVec *)local_58);
    bk_lib::pod_vector<long,_std::allocator<long>_>::ebo::~ebo((ebo *)local_58);
    bk_lib::pod_vector<long,_std::allocator<long>_>::ebo::~ebo((ebo *)&stack0xffffffffffffffc0);
    putchar(10);
  }
  if (final) {
    printf("%s%-*s: %u\n",this->format[0],(ulong)(uint)this->width_,"Calls",(ulong)(run->step + 1));
  }
  printf("%s%-*s: ",this->format[0],(ulong)(uint)this->width_,"Time");
  printf("%.3fs (Solving: %.2fs 1st Model: %.2fs Unsat: %.2fs)\n",SUB84(run->totalTime,0),
         run->solveTime,run->satTime,run->unsatTime);
  printf("%s%-*s: %.3fs\n",SUB84(run->cpuTime,0),this->format[0],(ulong)(uint)this->width_,
         "CPU Time");
  if (1 < ((uint)(run->facade->ctx).share_ & 0x3ff)) {
    printf("%s%-*s: %-8u",this->format[0],(ulong)(uint)this->width_,"Threads");
    printf(" (Winner: %u)\n",(ulong)((uint)(run->facade->ctx).share_ >> 10 & 0x3ff));
  }
  return;
}

Assistant:

void TextOutput::printSummary(const ClaspFacade::Summary& run, bool final) {
	if (final && callQ() != print_no){
		comment(1, "%s\n", finalSep);
	}
	const char* res = result[res_unknown];
	if      (run.unsat()) { res = result[res_unsat]; }
	else if (run.sat())   { res = !run.optimum() ? result[res_sat] : result[res_opt]; }
	if (*res) { printLN(cat_result, "%s", res); }
	if (verbosity() || stats(run)) {
		printBR(cat_comment);
		if (run.result.interrupted()){ printKeyValue((run.result.signal != SIGALRM ? "INTERRUPTED" : "TIME LIMIT"), "%u\n", uint32(1));  }
		const char* const moreStr = run.complete() ? "" :  "+";
		printKey("Models");
		printf("%" PRIu64 "%s\n", run.numEnum, moreStr);
		if (run.sat()) {
			if (run.consequences()) { printLN(cat_comment, "  %-*s: %s", width_-2, run.consequences(), (run.complete()?"yes":"unknown")); }
			if (run.costs())        { printKeyValue("  Optimum", "%s\n", run.optimum()?"yes":"unknown"); }
			if (run.optimize())     {
				if (run.optimal() > 1){ printKeyValue("  Optimal", "%" PRIu64"\n", run.optimal()); }
				printKey("Optimization");
				printCostsImpl(*run.costs(), ' ');
				printf("\n");
			}
			if (run.consequences()) {
				printKey("Consequences");
				printf("%u%s\n", numCons(run.ctx().output, *run.model()).first, moreStr);
			}
		}
		if (run.hasLower() && !run.optimum()) {
			printKey("Bounds");
			printBounds(run.lower(), run.costs() ? *run.costs() : SumVec());
			printf("\n");
		}
		if (final) { printKeyValue("Calls", "%u\n", run.step + 1); }
		printKey("Time");
		printf("%.3fs (Solving: %.2fs 1st Model: %.2fs Unsat: %.2fs)\n"
			, run.totalTime
			, run.solveTime
			, run.satTime
			, run.unsatTime);
		printKeyValue("CPU Time", "%.3fs\n", run.cpuTime);
		if (run.ctx().concurrency() > 1) {
			printKeyValue("Threads", "%-8u", run.ctx().concurrency());
			printf(" (Winner: %u)\n", run.ctx().winner());
		}
	}
}